

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::find_blob_index_by_name(Net *this,char *name)

{
  pointer pBVar1;
  int iVar2;
  int unaff_EBP;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  pBVar1 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
          super__Vector_impl_data._M_finish != pBVar1;
  if (bVar6) {
    iVar2 = std::__cxx11::string::compare((char *)pBVar1);
    uVar3 = 0;
    unaff_EBP = 0;
    if (iVar2 != 0) {
      lVar4 = 0x80;
      uVar5 = 1;
      do {
        unaff_EBP = (int)uVar3;
        pBVar1 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar6 = uVar5 < (ulong)((long)(this->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 7)
        ;
        if (!bVar6) break;
        iVar2 = std::__cxx11::string::compare
                          ((char *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + 0x80;
        if (iVar2 == 0) {
          uVar3 = uVar5 & 0xffffffff;
        }
        unaff_EBP = (int)uVar3;
        uVar5 = uVar5 + 1;
      } while (iVar2 != 0);
    }
  }
  if (!bVar6) {
    fprintf(_stderr,"find_blob_index_by_name %s failed\n",name);
    unaff_EBP = -1;
  }
  return unaff_EBP;
}

Assistant:

int Net::find_blob_index_by_name(const char* name) const
{
    for (size_t i=0; i<blobs.size(); i++)
    {
        const Blob& blob = blobs[i];
        if (blob.name == name)
        {
            return static_cast<int>(i);
        }
    }

    fprintf(stderr, "find_blob_index_by_name %s failed\n", name);
    return -1;
}